

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

void GEO::Process::show_stats(void)

{
  ostream *poVar1;
  double dVar2;
  allocator local_1a1;
  string local_1a0 [32];
  String local_180 [32];
  String local_160 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140 [32];
  String local_120 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100 [32];
  String local_e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0 [32];
  string local_a0 [8];
  string s;
  ulong local_80;
  size_t mem_K;
  size_t mem_M;
  size_t mem_G;
  size_t r;
  size_t max_mem;
  size_t G;
  size_t M;
  size_t K;
  allocator local_29;
  string local_28 [32];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"Process",&local_29);
  poVar1 = Logger::out((string *)local_28);
  poVar1 = std::operator<<(poVar1,"Total elapsed time: ");
  dVar2 = SystemStopwatch::now();
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar2 - ::(anonymous_namespace)::start_time_);
  poVar1 = std::operator<<(poVar1,"s");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  M = 0x400;
  G = 0x100000;
  max_mem = 0x40000000;
  r = max_used_memory();
  mem_M = r >> 0x1e;
  mem_K = (r & 0x3fffffff) >> 0x14;
  local_80 = (r & 0xfffff) >> 10;
  mem_G = r & 0x3ff;
  std::__cxx11::string::string(local_a0);
  if (mem_M != 0) {
    String::to_string<unsigned_long>(local_e0,&mem_M);
    std::operator+(local_c0,(char *)local_e0);
    std::__cxx11::string::operator+=(local_a0,(string *)local_c0);
    std::__cxx11::string::~string((string *)local_c0);
    std::__cxx11::string::~string((string *)local_e0);
  }
  if (mem_K != 0) {
    String::to_string<unsigned_long>(local_120,&mem_K);
    std::operator+(local_100,(char *)local_120);
    std::__cxx11::string::operator+=(local_a0,(string *)local_100);
    std::__cxx11::string::~string((string *)local_100);
    std::__cxx11::string::~string((string *)local_120);
  }
  if (local_80 != 0) {
    String::to_string<unsigned_long>(local_160,&local_80);
    std::operator+(local_140,(char *)local_160);
    std::__cxx11::string::operator+=(local_a0,(string *)local_140);
    std::__cxx11::string::~string((string *)local_140);
    std::__cxx11::string::~string((string *)local_160);
  }
  if (mem_G != 0) {
    String::to_string<unsigned_long>(local_180,&mem_G);
    std::__cxx11::string::operator+=(local_a0,(string *)local_180);
    std::__cxx11::string::~string((string *)local_180);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a0,"Process",&local_1a1);
  poVar1 = Logger::out((string *)local_1a0);
  poVar1 = std::operator<<(poVar1,"Maximum used memory: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,r);
  poVar1 = std::operator<<(poVar1," (");
  poVar1 = std::operator<<(poVar1,local_a0);
  poVar1 = std::operator<<(poVar1,")");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  std::__cxx11::string::~string(local_a0);
  return;
}

Assistant:

void show_stats() {

            Logger::out("Process") << "Total elapsed time: " 
                                   << SystemStopwatch::now() - start_time_
                                   << "s" << std::endl;

            const size_t K=size_t(1024);
            const size_t M=K*K;
            const size_t G=K*M;
            
            size_t max_mem = Process::max_used_memory() ;
            size_t r = max_mem;
            
            size_t mem_G = r / G;
            r = r % G;
            size_t mem_M = r / M;
            r = r % M;
            size_t mem_K = r / K;
            r = r % K;
            
            std::string s;
            if(mem_G != 0) {
                s += String::to_string(mem_G)+"G ";
            }
            if(mem_M != 0) {
                s += String::to_string(mem_M)+"M ";
            }
            if(mem_K != 0) {
                s += String::to_string(mem_K)+"K ";
            }
            if(r != 0) {
                s += String::to_string(r);
            }

            Logger::out("Process") << "Maximum used memory: " 
                                   << max_mem << " (" << s << ")"
                                   << std::endl;
        }